

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBrokerData.hpp
# Opt level: O0

void __thiscall
helics::NetworkBrokerData::NetworkBrokerData(NetworkBrokerData *this,InterfaceTypes type)

{
  undefined1 in_SIL;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  
  std::__cxx11::string::string(unaff_retaddr);
  std::__cxx11::string::string(unaff_retaddr);
  std::__cxx11::string::string(unaff_retaddr);
  std::__cxx11::string::string(unaff_retaddr);
  std::__cxx11::string::string(unaff_retaddr);
  *(undefined4 *)(in_RDI + 0xa0) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xa4) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xa8) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xac) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0xb0) = 0x1000;
  *(undefined4 *)(in_RDI + 0xb4) = 0x100;
  *(undefined4 *)(in_RDI + 0xb8) = 5;
  *(undefined1 *)(in_RDI + 0xbc) = 0;
  *(undefined1 *)(in_RDI + 0xbd) = 0;
  *(undefined1 *)(in_RDI + 0xbe) = 0;
  *(undefined1 *)(in_RDI + 0xbf) = 0;
  *(undefined1 *)(in_RDI + 0xc0) = 0;
  *(undefined1 *)(in_RDI + 0xc1) = 0;
  *(undefined1 *)(in_RDI + 0xc2) = 0;
  *(undefined1 *)(in_RDI + 0xc3) = 0;
  *(undefined1 *)(in_RDI + 0xc4) = 0;
  *(undefined1 *)(in_RDI + 0xc5) = 0;
  *(undefined1 *)(in_RDI + 0xc6) = 0;
  std::__cxx11::string::string(unaff_retaddr);
  *(undefined1 *)(in_RDI + 0xe8) = in_SIL;
  return;
}

Assistant:

explicit NetworkBrokerData(gmlc::networking::InterfaceTypes type): allowedType(type) {}